

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O0

void __thiscall
ON_ErrorEvent::ON_ErrorEvent
          (ON_ErrorEvent *this,Type event_type,char *file_name,uint line_number,char *function_name,
          char *description)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char *local_90;
  ulong local_88;
  size_t i_2;
  size_t i_1;
  size_t i;
  char *c1;
  char *c;
  size_t cap;
  size_t description_length;
  size_t function_name_length;
  size_t file_name_length;
  size_t buffer_capacity;
  char *description_local;
  char *function_name_local;
  char *pcStack_20;
  uint line_number_local;
  char *file_name_local;
  Type event_type_local;
  ON_ErrorEvent *this_local;
  
  this->m_event_type = event_type;
  this->m_reserved1 = '\0';
  this->m_reserved2 = 0;
  this->m_line_number = line_number;
  this->m_file_name = (char *)0x0;
  this->m_function_name = (char *)0x0;
  this->m_description = (char *)0x0;
  local_90 = this->m_buffer;
  do {
    *local_90 = '\0';
    local_90 = local_90 + 1;
  } while ((ON_ErrorEvent *)local_90 != this + 1);
  iVar1 = ON_String::Length(file_name);
  function_name_length = (size_t)iVar1;
  iVar1 = ON_String::Length(function_name);
  description_length = (size_t)iVar1;
  iVar1 = ON_String::Length(description);
  uVar2 = (ulong)iVar1;
  description_local = function_name;
  pcStack_20 = file_name;
  if (0x80 < function_name_length + description_length + uVar2 + 3) {
    if (0x20 < function_name_length) {
      pcStack_20 = file_name + (function_name_length - 0x20);
      function_name_length = 0x20;
    }
    if ((0x80 < function_name_length + description_length + uVar2 + 3) &&
       (0x20 < description_length)) {
      description_local = function_name + (description_length - 0x20);
      description_length = 0x20;
    }
  }
  c1 = this->m_buffer;
  pcVar3 = this->m_buffer + 0x7f;
  if ((function_name_length != 0) && (c1 < pcVar3)) {
    this->m_file_name = c1;
    for (i_1 = 0; i_1 < function_name_length && c1 < pcVar3; i_1 = i_1 + 1) {
      *c1 = pcStack_20[i_1];
      c1 = c1 + 1;
    }
    if (c1 < pcVar3) {
      *c1 = '\0';
      c1 = c1 + 1;
    }
  }
  if ((description_length != 0) && (c1 < pcVar3)) {
    this->m_function_name = c1;
    for (i_2 = 0; i_2 < description_length && c1 < pcVar3; i_2 = i_2 + 1) {
      *c1 = description_local[i_2];
      c1 = c1 + 1;
    }
    if (c1 < pcVar3) {
      *c1 = '\0';
      c1 = c1 + 1;
    }
  }
  if ((uVar2 != 0) && (c1 < pcVar3)) {
    this->m_description = c1;
    for (local_88 = 0; local_88 < uVar2 && c1 < pcVar3; local_88 = local_88 + 1) {
      *c1 = description[local_88];
      c1 = c1 + 1;
    }
    if (c1 < pcVar3) {
      *c1 = '\0';
    }
  }
  *pcVar3 = '\0';
  return;
}

Assistant:

ON_ErrorEvent::ON_ErrorEvent(
  ON_ErrorEvent::Type event_type,
  const char* file_name,
  unsigned int line_number,
  const char* function_name,
  const char* description
)
  : m_event_type(event_type)
  , m_line_number(line_number)
{
  const size_t buffer_capacity = sizeof(m_buffer) / sizeof(m_buffer[0]);
  size_t file_name_length = ON_String::Length(file_name);
  size_t function_name_length = ON_String::Length(function_name);
  size_t description_length = ON_String::Length(description);
  if (file_name_length + function_name_length + description_length + 3 > buffer_capacity)
  {
    const size_t cap = buffer_capacity / 4;
    if (file_name_length > cap )
    {
      file_name += (file_name_length - cap);
      file_name_length = cap;
    }
    if (file_name_length + function_name_length + description_length + 3 > buffer_capacity)
    {
      if (function_name_length > cap)
      {
        function_name += (function_name_length - cap);
        function_name_length = cap;
      }
    }
  }

  char* c = m_buffer;
  char* c1 = m_buffer + (buffer_capacity - 1);

  if (file_name_length > 0 && c < c1)
  {
    m_file_name = c;
    for (size_t i = 0; i < file_name_length && c < c1; i++)
      *c++ = file_name[i];
    if (c < c1)
      *c++ = 0;
  }

  if (function_name_length > 0 && c < c1)
  {
    m_function_name = c;
    for (size_t i = 0; i < function_name_length && c < c1; i++)
      *c++ = function_name[i];
    if (c < c1)
      *c++ = 0;
  }

  if (description_length > 0 && c < c1)
  {
    m_description = c;
    for (size_t i = 0; i < description_length && c < c1; i++)
      *c++ = description[i];
    if (c < c1)
      *c++ = 0;
  }

  *c1 = 0;
}